

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_application-api.cpp
# Opt level: O0

void __thiscall
AdiakApplicationAPI_CXX_BasicTypes_Test::~AdiakApplicationAPI_CXX_BasicTypes_Test
          (AdiakApplicationAPI_CXX_BasicTypes_Test *this)

{
  AdiakApplicationAPI_CXX_BasicTypes_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(AdiakApplicationAPI, CXX_BasicTypes)
{
    EXPECT_TRUE(adiak::value("cxx:int", -42));
    EXPECT_TRUE(adiak::value("cxx:uint", 42u));
    EXPECT_TRUE(adiak::value("cxx:int64", 9876543210ll));
    EXPECT_TRUE(adiak::value("cxx:const char*", "Hello Adiak"));
    EXPECT_TRUE(adiak::value("cxx:std::string", std::string("Hello Adiak")));
    EXPECT_TRUE(adiak::value("cxx:version", adiak::version("1.2.3a4")));
    EXPECT_TRUE(adiak::value("cxx:path", adiak::path("/a/b/c")));
    EXPECT_TRUE(adiak::value("cxx:catstring", adiak::catstring(std::string("cat"))));

    const int test_cat = 4242;
    EXPECT_TRUE(adiak::value("cxx:new_category", 42, test_cat, "subcat:cxx"));

    adiak_datatype_t* dtype = nullptr;
    adiak_value_t* val = nullptr;
    int cat = 0;
    const char* subcat = nullptr;
    adiak_value_t subval;
    adiak_datatype_t* subtype = nullptr;

    EXPECT_EQ(adiak_get_nameval("cxx:int", &dtype, &val, &cat, &subcat), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_int);
    EXPECT_EQ(val->v_int, -42);
    EXPECT_EQ(cat, adiak_general);
    EXPECT_EQ(adiak_num_subvals(dtype), 0);
    EXPECT_EQ(adiak_get_subval(dtype, val, 0, &subtype, &subval), -1);

    EXPECT_EQ(adiak_get_nameval("cxx:uint", &dtype, &val, nullptr, nullptr), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_uint);
    EXPECT_EQ(static_cast<unsigned int>(val->v_int), 42u);

    EXPECT_EQ(adiak_get_nameval("cxx:int64", &dtype, &val, nullptr, nullptr), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_longlong);
    EXPECT_EQ(val->v_longlong, 9876543210ll);

    EXPECT_EQ(adiak_get_nameval("cxx:const char*", &dtype, &val, nullptr, nullptr), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_string);
    EXPECT_STREQ(static_cast<char*>(val->v_ptr), "Hello Adiak");

    EXPECT_EQ(adiak_get_nameval("cxx:std::string", &dtype, &val, nullptr, nullptr), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_string);
    EXPECT_STREQ(static_cast<char*>(val->v_ptr), "Hello Adiak");

    EXPECT_EQ(adiak_get_nameval("cxx:version", &dtype, &val, nullptr, nullptr), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_version);
    EXPECT_STREQ(static_cast<char*>(val->v_ptr), "1.2.3a4");

    EXPECT_EQ(adiak_get_nameval("cxx:path", &dtype, &val, nullptr, nullptr), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_path);
    EXPECT_STREQ(static_cast<char*>(val->v_ptr), "/a/b/c");

    EXPECT_EQ(adiak_get_nameval("cxx:catstring", &dtype, &val, nullptr, nullptr), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_catstring);
    EXPECT_STREQ(static_cast<char*>(val->v_ptr), "cat");

    EXPECT_EQ(adiak_get_nameval("cxx:new_category", &dtype, &val, &cat, &subcat), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_int);
    EXPECT_EQ(val->v_int, 42);
    EXPECT_EQ(cat, test_cat);
    EXPECT_STREQ(subcat, "subcat:cxx");
}